

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

int xmlFetchXMLCatalogFile(xmlCatalogEntryPtr catal)

{
  xmlGenericErrorFunc p_Var1;
  void *pvVar2;
  xmlChar *str1;
  xmlCatalogPrefer xVar3;
  int in_EAX;
  int extraout_EAX;
  uint uVar4;
  int iVar5;
  _xmlCatalogEntry *p_Var6;
  xmlGenericErrorFunc *pp_Var7;
  void **ppvVar8;
  xmlDocPtr doc;
  xmlNodePtr node;
  xmlCatalogEntryPtr parent;
  xmlChar *pxVar9;
  xmlCatalogEntryPtr pxVar10;
  xmlCatalogPrefer prefer;
  
  if (catal->URL == (xmlChar *)0x0) {
    return in_EAX;
  }
  xmlRMutexLock(xmlCatalogMutex);
  if (catal->children != (_xmlCatalogEntry *)0x0) goto LAB_0013d0a0;
  if (xmlCatalogXMLFiles != (xmlHashTablePtr)0x0) {
    p_Var6 = (_xmlCatalogEntry *)xmlHashLookup(xmlCatalogXMLFiles,catal->URL);
    if (p_Var6 != (_xmlCatalogEntry *)0x0) {
      if (xmlDebugCatalogs != 0) {
        pp_Var7 = __xmlGenericError();
        p_Var1 = *pp_Var7;
        ppvVar8 = __xmlGenericErrorContext();
        (*p_Var1)(*ppvVar8,"Found %s in file hash\n",catal->URL);
      }
      if (catal->type == XML_CATA_CATALOG) {
        p_Var6 = p_Var6->children;
      }
      catal->children = p_Var6;
      catal->dealloc = 0;
      goto LAB_0013d0a0;
    }
    if (xmlDebugCatalogs != 0) {
      pp_Var7 = __xmlGenericError();
      p_Var1 = *pp_Var7;
      ppvVar8 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar8,"%s not found in file hash\n",catal->URL);
    }
  }
  pxVar9 = catal->URL;
  if (pxVar9 == (xmlChar *)0x0) {
LAB_0013d33d:
    parent = (xmlCatalogEntryPtr)0x0;
  }
  else {
    prefer = catal->prefer;
    doc = xmlParseCatalogFile((char *)pxVar9);
    if (doc == (xmlDocPtr)0x0) {
      if (xmlDebugCatalogs == 0) goto LAB_0013d33d;
      pp_Var7 = __xmlGenericError();
      p_Var1 = *pp_Var7;
      ppvVar8 = __xmlGenericErrorContext();
      parent = (xmlCatalogEntryPtr)0x0;
      (*p_Var1)(*ppvVar8,"Failed to parse catalog %s\n",pxVar9);
    }
    else {
      if (xmlDebugCatalogs != 0) {
        pp_Var7 = __xmlGenericError();
        p_Var1 = *pp_Var7;
        ppvVar8 = __xmlGenericErrorContext();
        pvVar2 = *ppvVar8;
        uVar4 = xmlGetThreadId();
        (*p_Var1)(pvVar2,"%d Parsing catalog %s\n",(ulong)uVar4);
      }
      node = xmlDocGetRootElement(doc);
      if (node == (xmlNodePtr)0x0) {
LAB_0013d29e:
        parent = (xmlCatalogEntryPtr)0x0;
        __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0
                        ,doc,0x14,0x675,XML_ERR_ERROR,(char *)0x0,0,(char *)pxVar9,(char *)0x0,
                        (char *)0x0,0,0,"File %s is not an XML Catalog\n",pxVar9,0,0);
      }
      else {
        iVar5 = xmlStrEqual(node->name,"catalog");
        if (((iVar5 == 0) || (node->ns == (xmlNs *)0x0)) ||
           (str1 = node->ns->href, str1 == (xmlChar *)0x0)) goto LAB_0013d29e;
        iVar5 = xmlStrEqual(str1,(xmlChar *)"urn:oasis:names:tc:entity:xmlns:xml:catalog");
        if (iVar5 == 0) goto LAB_0013d29e;
        parent = xmlNewCatalogEntry(XML_CATA_CATALOG,(xmlChar *)0x0,pxVar9,(xmlChar *)0x0,prefer,
                                    (xmlCatalogEntryPtr)0x0);
        if (parent == (xmlCatalogEntryPtr)0x0) {
          xmlFreeDoc(doc);
          goto LAB_0013d33d;
        }
        pxVar9 = xmlGetProp(node,(xmlChar *)"prefer");
        if (pxVar9 != (xmlChar *)0x0) {
          iVar5 = xmlStrEqual(pxVar9,"system");
          xVar3 = XML_CATA_PREFER_SYSTEM;
          if (iVar5 == 0) {
            iVar5 = xmlStrEqual(pxVar9,(xmlChar *)"public");
            xVar3 = XML_CATA_PREFER_PUBLIC;
            if (iVar5 == 0) {
              xmlCatalogErr((xmlCatalogEntryPtr)0x0,node,0x674,"Invalid value for prefer: \'%s\'\n",
                            pxVar9,(xmlChar *)0x0,(xmlChar *)0x0);
              xVar3 = prefer;
            }
          }
          prefer = xVar3;
          (*xmlFree)(pxVar9);
        }
        xmlParseXMLCatalogNodeList(node->children,prefer,parent,(xmlCatalogEntryPtr)0x0);
      }
      xmlFreeDoc(doc);
    }
  }
  if (parent == (xmlCatalogEntryPtr)0x0) {
    catal->type = XML_CATA_BROKEN_CATALOG;
  }
  else {
    pxVar10 = parent;
    if (catal->type == XML_CATA_CATALOG) {
      pxVar10 = parent->children;
    }
    catal->children = pxVar10;
    parent->dealloc = 1;
    if (xmlCatalogXMLFiles == (xmlHashTablePtr)0x0) {
      xmlCatalogXMLFiles = xmlHashCreate(10);
    }
    if (xmlCatalogXMLFiles != (xmlHashTablePtr)0x0) {
      if (xmlDebugCatalogs != 0) {
        pp_Var7 = __xmlGenericError();
        p_Var1 = *pp_Var7;
        ppvVar8 = __xmlGenericErrorContext();
        (*p_Var1)(*ppvVar8,"%s added to file hash\n",catal->URL);
      }
      xmlHashAddEntry(xmlCatalogXMLFiles,catal->URL,parent);
    }
  }
LAB_0013d0a0:
  xmlRMutexUnlock(xmlCatalogMutex);
  return extraout_EAX;
}

Assistant:

static int
xmlFetchXMLCatalogFile(xmlCatalogEntryPtr catal) {
    xmlCatalogEntryPtr doc;

    if (catal == NULL)
	return(-1);
    if (catal->URL == NULL)
	return(-1);

    /*
     * lock the whole catalog for modification
     */
    xmlRMutexLock(xmlCatalogMutex);
    if (catal->children != NULL) {
	/* Okay someone else did it in the meantime */
	xmlRMutexUnlock(xmlCatalogMutex);
	return(0);
    }

    if (xmlCatalogXMLFiles != NULL) {
	doc = (xmlCatalogEntryPtr)
	    xmlHashLookup(xmlCatalogXMLFiles, catal->URL);
	if (doc != NULL) {
	    if (xmlDebugCatalogs)
		xmlGenericError(xmlGenericErrorContext,
		    "Found %s in file hash\n", catal->URL);

	    if (catal->type == XML_CATA_CATALOG)
		catal->children = doc->children;
	    else
		catal->children = doc;
	    catal->dealloc = 0;
	    xmlRMutexUnlock(xmlCatalogMutex);
	    return(0);
	}
	if (xmlDebugCatalogs)
	    xmlGenericError(xmlGenericErrorContext,
		"%s not found in file hash\n", catal->URL);
    }

    /*
     * Fetch and parse. Note that xmlParseXMLCatalogFile does not
     * use the existing catalog, there is no recursion allowed at
     * that level.
     */
    doc = xmlParseXMLCatalogFile(catal->prefer, catal->URL);
    if (doc == NULL) {
	catal->type = XML_CATA_BROKEN_CATALOG;
	xmlRMutexUnlock(xmlCatalogMutex);
	return(-1);
    }

    if (catal->type == XML_CATA_CATALOG)
	catal->children = doc->children;
    else
	catal->children = doc;

    doc->dealloc = 1;

    if (xmlCatalogXMLFiles == NULL)
	xmlCatalogXMLFiles = xmlHashCreate(10);
    if (xmlCatalogXMLFiles != NULL) {
	if (xmlDebugCatalogs)
	    xmlGenericError(xmlGenericErrorContext,
		"%s added to file hash\n", catal->URL);
	xmlHashAddEntry(xmlCatalogXMLFiles, catal->URL, doc);
    }
    xmlRMutexUnlock(xmlCatalogMutex);
    return(0);
}